

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O0

vector<std::byte,_std::allocator<std::byte>_> * ParseHex<std::byte>(string_view hex_str)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> *in_RDI;
  long in_FS_OFFSET;
  optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *in_stack_ffffffffffffff58;
  vector<std::byte,_std::allocator<std::byte>_> *__u;
  optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *this;
  undefined1 in_stack_ffffffffffffffe0 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)&stack0xffffffffffffffd8;
  __u = in_RDI;
  TryParseHex<std::byte>((string_view)in_stack_ffffffffffffffe0);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffff58);
  std::optional<std::vector<std::byte,std::allocator<std::byte>>>::
  value_or<std::vector<std::byte,std::allocator<std::byte>>>(this,__u);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector(__u);
  std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::~optional
            (in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<Byte> ParseHex(std::string_view hex_str)
{
    return TryParseHex<Byte>(hex_str).value_or(std::vector<Byte>{});
}